

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

void __thiscall
Clasp::Asp::PrgBody::PrgBody
          (PrgBody *this,uint32 id,LogicProgram *prg,LitSpan *lits,uint32 pos,bool addDeps)

{
  size_t sVar1;
  int *piVar2;
  PrgBody *pPVar3;
  uint uVar4;
  char *exp;
  uint uVar5;
  char *file;
  int ec;
  char *fmt;
  long lVar6;
  Literal *p [2];
  Literal local_4c;
  PrgBody *local_48 [2];
  LogicProgram *local_38;
  
  local_38 = prg;
  this->super_PrgNode = (PrgNode)(((ulong)(id & 0xfffffff) << 0x20) + 1);
  if (id < 0xfffffff) {
    uVar5 = (uint)lits->size;
    if (uVar5 < 0x2000000) {
      *(uint *)&this->field_0x8 = uVar5;
      this->unsupp_ = pos;
      local_48[0] = this + 1;
      local_48[1] = (PrgBody *)(&this[1].super_PrgNode.field_0x0 + (ulong)pos * 4);
      sVar1 = lits->size;
      if (sVar1 != 0) {
        piVar2 = lits->first;
        lVar6 = 0;
        do {
          uVar5 = *(uint *)((long)piVar2 + lVar6);
          if (uVar5 == 0) {
            file = 
            "Clasp::Asp::PrgBody::PrgBody(uint32, LogicProgram &, const Potassco::LitSpan &, uint32, bool)"
            ;
            exp = "*it != 0";
            fmt = "body not simplified";
            ec = -2;
            uVar5 = 0x29f;
            goto LAB_0014b7a5;
          }
          uVar4 = uVar5 * -4 + 2;
          if (-1 < (int)uVar5) {
            uVar4 = uVar5 * 4;
          }
          pPVar3 = local_48[uVar5 >> 0x1f];
          *(uint *)&pPVar3->super_PrgNode = uVar4;
          if (addDeps) {
            local_4c.rep_ = uVar4 & 2 | id << 2;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (&(local_38->atoms_).ebo_.buf[uVar4 >> 2]->deps_,&local_4c);
          }
          local_48[uVar5 >> 0x1f] = (PrgBody *)&(pPVar3->super_PrgNode).field_0x4;
          lVar6 = lVar6 + 4;
        } while (sVar1 << 2 != lVar6);
      }
      return;
    }
    file = "void Clasp::Asp::PrgBody::init(Body_t, uint32)";
    exp = "sz <= maxSize";
    fmt = "body too large";
    ec = -2;
    uVar5 = 0x2c1;
  }
  else {
    file = "Clasp::Asp::PrgNode::PrgNode(uint32, bool)";
    exp = "id < noNode";
    fmt = "Id out of range";
    ec = 0x4b;
    uVar5 = 0x193;
  }
LAB_0014b7a5:
  Potassco::fail(ec,file,uVar5,exp,fmt,0);
}

Assistant:

PrgBody::PrgBody(uint32 id, LogicProgram& prg, const Potassco::LitSpan& lits, uint32 pos, bool addDeps)
	: PrgNode(id, true) {
	init(Body_t::Normal, toU32(Potassco::size(lits)));
	Norm* c = new (data_)Norm();
	unsupp_ = pos;
	// store B+ followed by B-
	Literal* p[2] = {c->lits, c->lits + pos};
	for (Potassco::LitSpan::iterator it = Potassco::begin(lits), end = Potassco::end(lits); it != end; ++it) {
		POTASSCO_REQUIRE(*it != 0, "body not simplified");
		Literal*& n = p[*it < 0];
		*n = toLit(*it);
		if (addDeps) { prg.getAtom(n->var())->addDep(id, !n->sign()); }
		++n;
	}
}